

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void populate_thresh_to_force_zeromv_skip(AV1_COMP *cpi)

{
  int iVar1;
  long in_RDI;
  double dVar2;
  uint thresh_exit_part_blk;
  int num_block_pix;
  BLOCK_SIZE bsize;
  int num_128x128_pix;
  uint thresh_exit_128x128_part;
  uint local_20;
  byte local_11;
  
  if (*(int *)(in_RDI + 0x60db0) != 0) {
    for (local_11 = 0; local_11 < 0x16; local_11 = local_11 + 1) {
      iVar1 = (uint)block_size_wide[local_11] * (uint)block_size_high[local_11];
      dVar2 = sqrt((double)iVar1 * 6.103515625e-05);
      local_20 = (uint)(long)(dVar2 * 10000.0 + 0.5);
      if ((uint)(iVar1 * 4) <= local_20) {
        local_20 = iVar1 * 4;
      }
      *(uint *)(in_RDI + 0x9d6ac + (ulong)local_11 * 4) = local_20;
    }
  }
  return;
}

Assistant:

static void populate_thresh_to_force_zeromv_skip(AV1_COMP *cpi) {
  if (cpi->sf.rt_sf.part_early_exit_zeromv == 0) return;

  // Threshold for forcing zeromv-skip decision is as below:
  // For 128x128 blocks, threshold is 10000 and per pixel threshold is 0.6103.
  // For 64x64 blocks, threshold is 5000 and per pixel threshold is 1.221
  // allowing slightly higher error for smaller blocks.
  // Per Pixel Threshold of 64x64 block        Area of 64x64 block         1  1
  // ------------------------------------=sqrt(---------------------)=sqrt(-)=-
  // Per Pixel Threshold of 128x128 block      Area of 128x128 block       4  2
  // Thus, per pixel thresholds for blocks of size 32x32, 16x16,...  can be
  // chosen as 2.442, 4.884,.... As the per pixel error tends to be higher for
  // small blocks, the same is clipped to 4.
  const unsigned int thresh_exit_128x128_part = FORCE_ZMV_SKIP_128X128_BLK_DIFF;
  const int num_128x128_pix =
      block_size_wide[BLOCK_128X128] * block_size_high[BLOCK_128X128];

  for (BLOCK_SIZE bsize = BLOCK_4X4; bsize < BLOCK_SIZES_ALL; bsize++) {
    const int num_block_pix = block_size_wide[bsize] * block_size_high[bsize];

    // Calculate the threshold for zeromv-skip decision based on area of the
    // partition
    unsigned int thresh_exit_part_blk =
        (unsigned int)(thresh_exit_128x128_part *
                           sqrt((double)num_block_pix / num_128x128_pix) +
                       0.5);
    thresh_exit_part_blk = AOMMIN(
        thresh_exit_part_blk,
        (unsigned int)(FORCE_ZMV_SKIP_MAX_PER_PIXEL_DIFF * num_block_pix));
    cpi->zeromv_skip_thresh_exit_part[bsize] = thresh_exit_part_blk;
  }
}